

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int invokeValueDestructor(void *p,_func_void_void_ptr *xDel,sqlite3_context *pCtx)

{
  int extraout_EAX;
  code *pcVar1;
  
  pcVar1 = xDel + 1;
  if ((code *)0x1 < pcVar1) {
    pcVar1 = (code *)(*xDel)(p);
  }
  if (pCtx != (sqlite3_context *)0x0) {
    sqlite3_result_error_toobig(pCtx);
    return extraout_EAX;
  }
  return (int)pcVar1;
}

Assistant:

static int invokeValueDestructor(
  const void *p,             /* Value to destroy */
  void (*xDel)(void*),       /* The destructor */
  sqlite3_context *pCtx      /* Set a SQLITE_TOOBIG error if no NULL */
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( xDel==0 ){
    /* noop */
  }else if( xDel==SQLITE_TRANSIENT ){
    /* noop */
  }else{
    xDel((void*)p);
  }
  if( pCtx ) sqlite3_result_error_toobig(pCtx);
  return SQLITE_TOOBIG;
}